

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O1

TestStatus * __thiscall
vkt::shaderexecutor::
BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Vector<float,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Vector<float,_4>,_tcu::Vector<float,_4>_>_>
::iterate(TestStatus *__return_storage_ptr__,
         BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Vector<float,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Vector<float,_4>,_tcu::Vector<float,_4>_>_>
         *this)

{
  FloatFormat *samplings;
  double *pdVar1;
  _Base_ptr p_Var2;
  ostringstream *poVar3;
  _Rb_tree_node_base *p_Var4;
  ostream *poVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  Precision PVar7;
  Samplings<vkt::shaderexecutor::InTypes<tcu::Vector<float,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  *this_00;
  size_t sVar8;
  Statement *pSVar9;
  ShaderExecutor *pSVar10;
  Variable<tcu::Vector<float,_4>_> *pVVar11;
  pointer pcVar12;
  TestStatus *pTVar13;
  pointer pVVar14;
  bool bVar15;
  bool bVar16;
  int iVar17;
  undefined8 uVar18;
  long lVar19;
  long lVar20;
  IVal *pIVar21;
  undefined8 *puVar22;
  uint uVar23;
  Vector<float,_4> *val;
  string *psVar24;
  char *pcVar25;
  _Base_ptr p_Var26;
  byte bVar27;
  IVal in2;
  IVal in3;
  IVal in1;
  FuncSet funcs;
  IVal in0;
  FloatFormat highpFmt;
  Environment env;
  Outputs<vkt::shaderexecutor::OutTypes<tcu::Vector<float,_4>,_tcu::Vector<float,_4>_>_> outputs;
  void *outputArr [2];
  Inputs<vkt::shaderexecutor::InTypes<tcu::Vector<float,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  inputs;
  void *inputArr [4];
  ResultCollector status;
  ostringstream oss;
  deUint32 in_stack_fffffffffffffa28;
  string local_5c8;
  TestLog *local_5a8;
  size_t local_5a0;
  ulong local_598;
  string local_590;
  FloatFormat *local_570;
  undefined1 local_568 [16];
  undefined1 local_558 [80];
  undefined1 local_508 [12];
  YesNoMaybe YStack_4fc;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4f8;
  _Rb_tree_node_base *local_4e8;
  double local_4e0;
  undefined1 auStack_4b8 [8];
  undefined8 uStack_4b0;
  undefined1 local_4a8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_498;
  double local_488;
  Precision local_480;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  *local_478;
  undefined4 local_470;
  ios_base local_438 [8];
  ios_base local_430 [264];
  FloatFormat local_328;
  TestStatus *local_300;
  long local_2f8;
  long local_2f0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  local_2e8;
  Outputs<vkt::shaderexecutor::OutTypes<tcu::Vector<float,_4>,_tcu::Vector<float,_4>_>_> local_2b8;
  pointer local_288;
  pointer local_280;
  Inputs<vkt::shaderexecutor::InTypes<tcu::Vector<float,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  local_278;
  pointer local_218;
  pointer local_210;
  pointer local_208;
  pointer local_200;
  ResultCollector local_1f8;
  IVal local_1a8;
  ios_base local_138 [264];
  
  bVar27 = 0;
  this_00 = this->m_samplings;
  samplings = &(this->m_caseCtx).floatFormat;
  PVar7 = (this->m_caseCtx).precision;
  sVar8 = (this->m_caseCtx).numRandoms;
  local_300 = __return_storage_ptr__;
  iVar17 = tcu::CommandLine::getBaseSeed(((this->m_caseCtx).testContext)->m_cmdLine);
  local_570 = samplings;
  generateInputs<vkt::shaderexecutor::InTypes<tcu::Vector<float,4>,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>
            (&local_278,(shaderexecutor *)this_00,
             (Samplings<vkt::shaderexecutor::InTypes<tcu::Vector<float,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
              *)samplings,(FloatFormat *)(ulong)PVar7,(Precision)sVar8,(ulong)(iVar17 + 0xdeadbeef),
             in_stack_fffffffffffffa28);
  pVVar14 = local_278.in0.
            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
            _M_impl.super__Vector_impl_data._M_start;
  local_5a0 = (long)local_278.in0.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_278.in0.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4;
  Outputs<vkt::shaderexecutor::OutTypes<tcu::Vector<float,_4>,_tcu::Vector<float,_4>_>_>::Outputs
            (&local_2b8,local_5a0);
  local_328.m_maxValue = (this->m_caseCtx).highpFormat.m_maxValue;
  local_328.m_minExp = (this->m_caseCtx).highpFormat.m_minExp;
  local_328.m_maxExp = (this->m_caseCtx).highpFormat.m_maxExp;
  local_328.m_fractionBits = (this->m_caseCtx).highpFormat.m_fractionBits;
  local_328.m_hasSubnormal = (this->m_caseCtx).highpFormat.m_hasSubnormal;
  local_328.m_hasInf = (this->m_caseCtx).highpFormat.m_hasInf;
  local_328.m_hasNaN = (this->m_caseCtx).highpFormat.m_hasNaN;
  local_328.m_exactPrecision = (this->m_caseCtx).highpFormat.m_exactPrecision;
  local_328._25_7_ = *(undefined7 *)&(this->m_caseCtx).highpFormat.field_0x19;
  local_2e8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_2e8._M_impl.super__Rb_tree_header._M_header;
  local_2e8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_2e8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_2e8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_2e8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_2e8._M_impl.super__Rb_tree_header._M_header._M_left;
  tcu::ResultCollector::ResultCollector(&local_1f8);
  local_5a8 = ((this->super_TestInstance).m_context)->m_testCtx->m_log;
  local_218 = local_278.in0.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_start;
  local_210 = local_278.in1.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_208 = local_278.in2.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_200 = local_278.in3.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_288 = local_2b8.out0.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_start;
  local_280 = local_2b8.out1.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_start;
  poVar3 = (ostringstream *)(local_4a8 + 8);
  local_4a8._0_8_ = local_5a8;
  std::__cxx11::ostringstream::ostringstream(poVar3);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"Statement: ",0xb);
  std::ostream::_M_insert<bool>(SUB81(poVar3,0));
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_4a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar3);
  std::ios_base::~ios_base(local_430);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
  p_Var4 = (_Rb_tree_node_base *)(local_508 + 8);
  local_508._8_4_ = _S_red;
  local_4f8._M_allocated_capacity = 0;
  local_4e0 = 0.0;
  pSVar9 = (this->m_stmt).super_SharedPtr<const_vkt::shaderexecutor::Statement>.m_ptr;
  local_4f8._8_8_ = p_Var4;
  local_4e8 = p_Var4;
  (*pSVar9->_vptr_Statement[4])(pSVar9,local_508);
  if ((_Rb_tree_node_base *)local_4f8._8_8_ != p_Var4) {
    uVar18 = local_4f8._8_8_;
    do {
      (**(code **)(**(long **)(uVar18 + 0x20) + 0x30))(*(long **)(uVar18 + 0x20),&local_1a8);
      uVar18 = std::_Rb_tree_increment((_Rb_tree_node_base *)uVar18);
    } while ((_Rb_tree_node_base *)uVar18 != p_Var4);
  }
  if (local_4e0 != 0.0) {
    poVar3 = (ostringstream *)(local_4a8 + 8);
    local_4a8._0_8_ = local_5a8;
    std::__cxx11::ostringstream::ostringstream(poVar3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar3,"Reference definitions:\n",0x17);
    std::__cxx11::stringbuf::str();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar3,(char *)local_568._0_8_,local_568._8_8_);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_4a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    if ((IVal *)local_568._0_8_ != (IVal *)local_558) {
      operator_delete((void *)local_568._0_8_,local_558._0_8_ + 1);
    }
    std::__cxx11::ostringstream::~ostringstream(poVar3);
    std::ios_base::~ios_base(local_430);
  }
  std::
  _Rb_tree<const_vkt::shaderexecutor::FuncBase_*,_const_vkt::shaderexecutor::FuncBase_*,_std::_Identity<const_vkt::shaderexecutor::FuncBase_*>,_std::less<const_vkt::shaderexecutor::FuncBase_*>,_std::allocator<const_vkt::shaderexecutor::FuncBase_*>_>
  ::~_Rb_tree((_Rb_tree<const_vkt::shaderexecutor::FuncBase_*,_const_vkt::shaderexecutor::FuncBase_*,_std::_Identity<const_vkt::shaderexecutor::FuncBase_*>,_std::less<const_vkt::shaderexecutor::FuncBase_*>,_std::allocator<const_vkt::shaderexecutor::FuncBase_*>_>
               *)local_508);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
  std::ios_base::~ios_base(local_138);
  pSVar10 = (this->m_executor).
            super_UniqueBase<vkt::shaderexecutor::ShaderExecutor,_de::DefaultDeleter<vkt::shaderexecutor::ShaderExecutor>_>
            .m_data.ptr;
  (*pSVar10->_vptr_ShaderExecutor[2])(pSVar10,local_5a0,&local_218,&local_288,0);
  lVar19 = 0x10;
  do {
    auStack_4b8[lVar19] = 0;
    *(undefined8 *)((long)&uStack_4b0 + lVar19) = 0x7ff0000000000000;
    *(undefined8 *)(local_4a8 + lVar19) = 0xfff0000000000000;
    lVar19 = lVar19 + 0x18;
  } while (lVar19 != 0x70);
  lVar19 = 0x10;
  do {
    auStack_4b8[lVar19] = 0;
    *(undefined8 *)((long)&uStack_4b0 + lVar19) = 0x7ff0000000000000;
    *(undefined8 *)(local_4a8 + lVar19) = 0xfff0000000000000;
    lVar19 = lVar19 + 0x18;
  } while (lVar19 != 0x70);
  lVar19 = 0x10;
  do {
    *(undefined1 *)((long)local_1a8.m_data + lVar19 + -0x10) = 0;
    *(undefined8 *)((long)local_1a8.m_data + lVar19 + -8) = 0x7ff0000000000000;
    *(undefined8 *)(&local_1a8.m_data[0].m_hasNaN + lVar19) = 0xfff0000000000000;
    lVar19 = lVar19 + 0x18;
  } while (lVar19 != 0x70);
  lVar19 = 0x10;
  do {
    *(undefined1 *)((long)local_1a8.m_data + lVar19 + -0x10) = 0;
    *(undefined8 *)((long)local_1a8.m_data + lVar19 + -8) = 0x7ff0000000000000;
    *(undefined8 *)(&local_1a8.m_data[0].m_hasNaN + lVar19) = 0xfff0000000000000;
    lVar19 = lVar19 + 0x18;
  } while (lVar19 != 0x70);
  lVar19 = 0x10;
  do {
    local_558[lVar19 + 0x40] = 0;
    *(undefined8 *)(local_558 + lVar19 + 0x48) = 0x7ff0000000000000;
    *(undefined8 *)(local_508 + lVar19) = 0xfff0000000000000;
    lVar19 = lVar19 + 0x18;
  } while (lVar19 != 0x70);
  lVar19 = 0x10;
  do {
    local_558[lVar19 + 0x40] = 0;
    *(undefined8 *)(local_558 + lVar19 + 0x48) = 0x7ff0000000000000;
    *(undefined8 *)(local_508 + lVar19) = 0xfff0000000000000;
    lVar19 = lVar19 + 0x18;
  } while (lVar19 != 0x70);
  Environment::bind<tcu::Vector<float,4>>
            ((Environment *)&local_2e8,
             (this->m_variables).in0.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_4>_>_>.m_ptr,
             (IVal *)local_4a8);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_2e8,
             (this->m_variables).in1.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             (IVal *)local_568);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_2e8,
             (this->m_variables).in2.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             (IVal *)&local_5c8);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_2e8,
             (this->m_variables).in3.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             (IVal *)&local_590);
  Environment::bind<tcu::Vector<float,4>>
            ((Environment *)&local_2e8,
             (this->m_variables).out0.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_4>_>_>.m_ptr,
             &local_1a8);
  Environment::bind<tcu::Vector<float,4>>
            ((Environment *)&local_2e8,
             (this->m_variables).out1.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_4>_>_>.m_ptr,
             (IVal *)local_508);
  if (local_278.in0.
      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
      super__Vector_impl_data._M_finish == pVVar14) {
    local_598 = 0;
  }
  else {
    local_2f8 = local_5a0 + (local_5a0 == 0);
    lVar19 = 0;
    local_598 = 0;
    do {
      lVar20 = 0x10;
      do {
        *(undefined1 *)((long)local_1a8.m_data + lVar20 + -0x10) = 0;
        *(undefined8 *)((long)local_1a8.m_data + lVar20 + -8) = 0x7ff0000000000000;
        *(undefined8 *)(&local_1a8.m_data[0].m_hasNaN + lVar20) = 0xfff0000000000000;
        lVar20 = lVar20 + 0x18;
      } while (lVar20 != 0x70);
      lVar20 = 0x10;
      do {
        *(undefined1 *)((long)local_1a8.m_data + lVar20 + -0x10) = 0;
        *(undefined8 *)((long)local_1a8.m_data + lVar20 + -8) = 0x7ff0000000000000;
        *(undefined8 *)(&local_1a8.m_data[0].m_hasNaN + lVar20) = 0xfff0000000000000;
        lVar20 = lVar20 + 0x18;
      } while (lVar20 != 0x70);
      lVar20 = 0x10;
      do {
        local_558[lVar20 + 0x40] = 0;
        *(undefined8 *)(local_558 + lVar20 + 0x48) = 0x7ff0000000000000;
        *(undefined8 *)(local_508 + lVar20) = 0xfff0000000000000;
        lVar20 = lVar20 + 0x18;
      } while (lVar20 != 0x70);
      lVar20 = 0x10;
      do {
        local_558[lVar20 + 0x40] = 0;
        *(undefined8 *)(local_558 + lVar20 + 0x48) = 0x7ff0000000000000;
        *(undefined8 *)(local_508 + lVar20) = 0xfff0000000000000;
        lVar20 = lVar20 + 0x18;
      } while (lVar20 != 0x70);
      local_5c8._M_dataplus._M_p =
           *(pointer *)
            local_278.in0.
            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
            _M_impl.super__Vector_impl_data._M_start[lVar19].m_data;
      local_5c8._M_string_length =
           *(size_type *)
            (local_278.in0.
             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_start[lVar19].m_data + 2);
      local_2f0 = lVar19;
      ContainerTraits<tcu::Vector<float,_4>,_tcu::Vector<tcu::Interval,_4>_>::doRound
                ((IVal *)local_568,local_570,(Vector<float,_4> *)&local_5c8);
      ContainerTraits<tcu::Vector<float,_4>,_tcu::Vector<tcu::Interval,_4>_>::doConvert
                ((IVal *)local_4a8,local_570,(IVal *)local_568);
      pIVar21 = Environment::lookup<tcu::Vector<float,4>>
                          ((Environment *)&local_2e8,
                           (this->m_variables).in0.
                           super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_4>_>_>
                           .m_ptr);
      puVar22 = (undefined8 *)local_4a8;
      for (lVar20 = 0xc; lVar20 != 0; lVar20 = lVar20 + -1) {
        *(undefined8 *)pIVar21->m_data = *puVar22;
        puVar22 = puVar22 + (ulong)bVar27 * -2 + 1;
        pIVar21 = (IVal *)((long)pIVar21 + ((ulong)bVar27 * -2 + 1) * 8);
      }
      Environment::lookup<vkt::shaderexecutor::Void>
                ((Environment *)&local_2e8,
                 (this->m_variables).in1.
                 super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
                 m_ptr);
      Environment::lookup<vkt::shaderexecutor::Void>
                ((Environment *)&local_2e8,
                 (this->m_variables).in2.
                 super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
                 m_ptr);
      Environment::lookup<vkt::shaderexecutor::Void>
                ((Environment *)&local_2e8,
                 (this->m_variables).in3.
                 super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
                 m_ptr);
      local_480 = (this->m_caseCtx).precision;
      local_488 = local_570->m_maxValue;
      local_4a8._0_8_ = *(undefined8 *)local_570;
      local_4a8._8_4_ = local_570->m_fractionBits;
      local_4a8._12_4_ = local_570->m_hasSubnormal;
      local_498._M_allocated_capacity._0_4_ = local_570->m_hasInf;
      local_498._M_allocated_capacity._4_4_ = local_570->m_hasNaN;
      local_498._8_1_ = local_570->m_exactPrecision;
      local_498._9_3_ = *(undefined3 *)&local_570->field_0x19;
      local_498._12_4_ = *(undefined4 *)&local_570->field_0x1c;
      local_470 = 0;
      pSVar9 = (this->m_stmt).super_SharedPtr<const_vkt::shaderexecutor::Statement>.m_ptr;
      local_478 = &local_2e8;
      (*pSVar9->_vptr_Statement[3])(pSVar9,local_4a8);
      pIVar21 = Environment::lookup<tcu::Vector<float,4>>
                          ((Environment *)&local_2e8,
                           (this->m_variables).out1.
                           super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_4>_>_>
                           .m_ptr);
      ContainerTraits<tcu::Vector<float,_4>,_tcu::Vector<tcu::Interval,_4>_>::doConvert
                ((IVal *)local_4a8,&local_328,pIVar21);
      psVar24 = (string *)local_4a8;
      pIVar21 = (IVal *)local_508;
      for (lVar20 = 0xc; lVar20 != 0; lVar20 = lVar20 + -1) {
        *(pointer *)pIVar21->m_data = (psVar24->_M_dataplus)._M_p;
        psVar24 = (string *)((long)psVar24 + (ulong)bVar27 * -0x10 + 8);
        pIVar21 = (IVal *)((long)pIVar21 + ((ulong)bVar27 * -2 + 1) * 8);
      }
      bVar15 = ContainerTraits<tcu::Vector<float,_4>,_tcu::Vector<tcu::Interval,_4>_>::doContains
                         ((IVal *)local_508,
                          local_2b8.out1.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + lVar19);
      local_4a8._0_8_ = local_4a8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_4a8,"Shader output 1 is outside acceptable range","");
      bVar15 = tcu::ResultCollector::check(&local_1f8,bVar15,(string *)local_4a8);
      if ((TestLog *)local_4a8._0_8_ != (TestLog *)(local_4a8 + 0x10)) {
        operator_delete((void *)local_4a8._0_8_,
                        CONCAT44(local_498._M_allocated_capacity._4_4_,
                                 local_498._M_allocated_capacity._0_4_) + 1);
      }
      pIVar21 = Environment::lookup<tcu::Vector<float,4>>
                          ((Environment *)&local_2e8,
                           (this->m_variables).out0.
                           super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_4>_>_>
                           .m_ptr);
      ContainerTraits<tcu::Vector<float,_4>,_tcu::Vector<tcu::Interval,_4>_>::doConvert
                ((IVal *)local_4a8,&local_328,pIVar21);
      psVar24 = (string *)local_4a8;
      pIVar21 = &local_1a8;
      for (lVar20 = 0xc; lVar20 != 0; lVar20 = lVar20 + -1) {
        *(pointer *)pIVar21->m_data = (psVar24->_M_dataplus)._M_p;
        psVar24 = (string *)((long)psVar24 + (ulong)bVar27 * -0x10 + 8);
        pIVar21 = (IVal *)((long)pIVar21 + ((ulong)bVar27 * -2 + 1) * 8);
      }
      bVar16 = ContainerTraits<tcu::Vector<float,_4>,_tcu::Vector<tcu::Interval,_4>_>::doContains
                         (&local_1a8,
                          local_2b8.out0.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + lVar19);
      local_4a8._0_8_ = local_4a8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_4a8,"Shader output 0 is outside acceptable range","");
      bVar16 = tcu::ResultCollector::check(&local_1f8,bVar16,(string *)local_4a8);
      if ((TestLog *)local_4a8._0_8_ != (TestLog *)(local_4a8 + 0x10)) {
        operator_delete((void *)local_4a8._0_8_,
                        CONCAT44(local_498._M_allocated_capacity._4_4_,
                                 local_498._M_allocated_capacity._0_4_) + 1);
      }
      uVar23 = (int)local_598 + ((byte)~(bVar15 && bVar16) & 1);
      local_598 = (ulong)uVar23;
      if ((int)uVar23 < 0x65 && (!bVar15 || !bVar16)) {
        local_4a8._0_8_ = local_5a8;
        poVar3 = (ostringstream *)(local_4a8 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar3);
        pcVar25 = "Failed";
        if (bVar15 && bVar16) {
          pcVar25 = "Passed";
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,pcVar25,6);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3," sample:\n",9);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"\t",1);
        pVVar11 = (this->m_variables).in0.
                  super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_4>_>_>.
                  m_ptr;
        val = (Vector<float,_4> *)local_558;
        pcVar12 = (pVVar11->m_name)._M_dataplus._M_p;
        local_568._0_8_ = val;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_568,pcVar12,pcVar12 + (pVVar11->m_name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_4a8 + 8),(char *)local_568._0_8_,local_568._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_4a8 + 8)," = ",3);
        valueToString<tcu::Vector<float,4>>
                  (&local_5c8,(shaderexecutor *)&local_328,
                   (FloatFormat *)
                   (local_278.in0.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + lVar19),val);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_4a8 + 8),local_5c8._M_dataplus._M_p,local_5c8._M_string_length)
        ;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_4a8 + 8),"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5c8._M_dataplus._M_p != &local_5c8.field_2) {
          operator_delete(local_5c8._M_dataplus._M_p,local_5c8.field_2._M_allocated_capacity + 1);
        }
        if ((Vector<float,_4> *)local_568._0_8_ != (Vector<float,_4> *)local_558) {
          operator_delete((void *)local_568._0_8_,local_558._0_8_ + 1);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_4a8 + 8),"\t",1);
        pVVar11 = (this->m_variables).out0.
                  super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_4>_>_>.
                  m_ptr;
        pIVar21 = (IVal *)local_558;
        pcVar12 = (pVVar11->m_name)._M_dataplus._M_p;
        local_568._0_8_ = pIVar21;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_568,pcVar12,pcVar12 + (pVVar11->m_name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_4a8 + 8),(char *)local_568._0_8_,local_568._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_4a8 + 8)," = ",3);
        valueToString<tcu::Vector<float,4>>
                  (&local_5c8,(shaderexecutor *)&local_328,
                   (FloatFormat *)
                   (local_2b8.out0.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + lVar19),(Vector<float,_4> *)pIVar21)
        ;
        poVar5 = (ostream *)(local_4a8 + 8);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,local_5c8._M_dataplus._M_p,local_5c8._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\tExpected range: ",0x11);
        intervalToString<tcu::Vector<float,4>>
                  (&local_590,(shaderexecutor *)&local_328,(FloatFormat *)&local_1a8,pIVar21);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_4a8 + 8),local_590._M_dataplus._M_p,local_590._M_string_length)
        ;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_4a8 + 8),"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_590._M_dataplus._M_p != &local_590.field_2) {
          operator_delete(local_590._M_dataplus._M_p,local_590.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5c8._M_dataplus._M_p != &local_5c8.field_2) {
          operator_delete(local_5c8._M_dataplus._M_p,local_5c8.field_2._M_allocated_capacity + 1);
        }
        if ((IVal *)local_568._0_8_ != (IVal *)local_558) {
          operator_delete((void *)local_568._0_8_,local_558._0_8_ + 1);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_4a8 + 8),"\t",1);
        pVVar11 = (this->m_variables).out1.
                  super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_4>_>_>.
                  m_ptr;
        pIVar21 = (IVal *)local_558;
        pcVar12 = (pVVar11->m_name)._M_dataplus._M_p;
        local_568._0_8_ = pIVar21;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_568,pcVar12,pcVar12 + (pVVar11->m_name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_4a8 + 8),(char *)local_568._0_8_,local_568._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_4a8 + 8)," = ",3);
        valueToString<tcu::Vector<float,4>>
                  (&local_5c8,(shaderexecutor *)&local_328,
                   (FloatFormat *)
                   (local_2b8.out1.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + lVar19),(Vector<float,_4> *)pIVar21)
        ;
        poVar5 = (ostream *)(local_4a8 + 8);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,local_5c8._M_dataplus._M_p,local_5c8._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\tExpected range: ",0x11);
        intervalToString<tcu::Vector<float,4>>
                  (&local_590,(shaderexecutor *)&local_328,(FloatFormat *)local_508,pIVar21);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,local_590._M_dataplus._M_p,local_590._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_590._M_dataplus._M_p != &local_590.field_2) {
          operator_delete(local_590._M_dataplus._M_p,local_590.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5c8._M_dataplus._M_p != &local_5c8.field_2) {
          operator_delete(local_5c8._M_dataplus._M_p,local_5c8.field_2._M_allocated_capacity + 1);
        }
        if ((IVal *)local_568._0_8_ != (IVal *)local_558) {
          operator_delete((void *)local_568._0_8_,local_558._0_8_ + 1);
        }
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_4a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_4a8 + 8));
        std::ios_base::~ios_base(local_430);
      }
      lVar19 = local_2f0 + 1;
    } while (lVar19 != local_2f8);
  }
  pTVar13 = local_300;
  iVar17 = (int)local_598;
  if (100 < iVar17) {
    poVar3 = (ostringstream *)(local_4a8 + 8);
    local_4a8._0_8_ = local_5a8;
    std::__cxx11::ostringstream::ostringstream(poVar3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"(Skipped ",9);
    std::ostream::operator<<(poVar3,iVar17 + -100);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3," messages.)",0xb);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_4a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar3);
    std::ios_base::~ios_base(local_430);
  }
  poVar3 = (ostringstream *)(local_4a8 + 8);
  if (iVar17 == 0) {
    local_4a8._0_8_ = local_5a8;
    std::__cxx11::ostringstream::ostringstream(poVar3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"All ",4);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3," inputs passed.",0xf);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_4a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  else {
    local_4a8._0_8_ = local_5a8;
    std::__cxx11::ostringstream::ostringstream(poVar3);
    std::ostream::operator<<(poVar3,iVar17);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"/",1);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3," inputs failed.",0xf);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_4a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  std::__cxx11::ostringstream::~ostringstream(poVar3);
  std::ios_base::~ios_base(local_430);
  if (iVar17 == 0) {
    local_4a8._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)(local_4a8 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_4a8,"Pass","");
    pTVar13->m_code = QP_TEST_RESULT_PASS;
    (pTVar13->m_description)._M_dataplus._M_p = (pointer)&(pTVar13->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pTVar13->m_description,local_4a8._0_8_,
               (char *)(local_4a8._0_8_ + CONCAT44(local_4a8._12_4_,local_4a8._8_4_)));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4a8._0_8_ ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_4a8 + 0x10)) goto LAB_008d66e3;
    uVar18 = (_Base_ptr)
             CONCAT44(local_498._M_allocated_capacity._4_4_,local_498._M_allocated_capacity._0_4_);
    local_508._0_8_ = local_4a8._0_8_;
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4a8);
    std::ostream::operator<<(local_4a8,iVar17);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4a8);
    std::ios_base::~ios_base(local_438);
    paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(local_4a8 + 0x10);
    local_4a8._0_8_ = paVar6;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_4a8," test failed. Check log for the details","");
    p_Var2 = (_Base_ptr)
             (CONCAT44(local_4a8._12_4_,local_4a8._8_4_) + CONCAT44(YStack_4fc,local_508._8_4_));
    uVar18 = (_Base_ptr)0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_508._0_8_ != &local_4f8) {
      uVar18 = local_4f8._M_allocated_capacity;
    }
    if ((ulong)uVar18 < p_Var2) {
      p_Var26 = (_Base_ptr)0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4a8._0_8_ != paVar6) {
        p_Var26 = (_Base_ptr)
                  CONCAT44(local_498._M_allocated_capacity._4_4_,
                           local_498._M_allocated_capacity._0_4_);
      }
      if (p_Var26 < p_Var2) goto LAB_008d656f;
      puVar22 = (undefined8 *)
                std::__cxx11::string::replace((ulong)local_4a8,0,(char *)0x0,local_508._0_8_);
    }
    else {
LAB_008d656f:
      puVar22 = (undefined8 *)std::__cxx11::string::_M_append(local_508,local_4a8._0_8_);
    }
    local_1a8.m_data[0]._0_8_ = &local_1a8.m_data[0].m_hi;
    pdVar1 = (double *)(puVar22 + 2);
    if ((double *)*puVar22 == pdVar1) {
      local_1a8.m_data[0].m_hi = *pdVar1;
      local_1a8.m_data[1]._0_4_ = *(undefined4 *)(puVar22 + 3);
      local_1a8.m_data[1]._4_4_ = *(undefined4 *)((long)puVar22 + 0x1c);
    }
    else {
      local_1a8.m_data[0].m_hi = *pdVar1;
      local_1a8.m_data[0]._0_8_ = (double *)*puVar22;
    }
    local_1a8.m_data[0].m_lo = (double)puVar22[1];
    *puVar22 = pdVar1;
    puVar22[1] = 0;
    *(undefined1 *)pdVar1 = 0;
    pTVar13->m_code = QP_TEST_RESULT_FAIL;
    (pTVar13->m_description)._M_dataplus._M_p = (pointer)&(pTVar13->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pTVar13->m_description,local_1a8.m_data[0]._0_8_,
               (undefined1 *)((long)local_1a8.m_data[0].m_lo + local_1a8.m_data[0]._0_8_));
    if ((double *)local_1a8.m_data[0]._0_8_ != &local_1a8.m_data[0].m_hi) {
      operator_delete((void *)local_1a8.m_data[0]._0_8_,(long)local_1a8.m_data[0].m_hi + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4a8._0_8_ != paVar6) {
      operator_delete((void *)local_4a8._0_8_,
                      CONCAT44(local_498._M_allocated_capacity._4_4_,
                               local_498._M_allocated_capacity._0_4_) + 1);
    }
    uVar18 = local_4f8._M_allocated_capacity;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_508._0_8_ == &local_4f8) goto LAB_008d66e3;
  }
  operator_delete((void *)local_508._0_8_,(ulong)((long)&((_Base_ptr)uVar18)->_M_color + 1));
LAB_008d66e3:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8.m_message._M_dataplus._M_p != &local_1f8.m_message.field_2) {
    operator_delete(local_1f8.m_message._M_dataplus._M_p,
                    local_1f8.m_message.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8.m_prefix._M_dataplus._M_p != &local_1f8.m_prefix.field_2) {
    operator_delete(local_1f8.m_prefix._M_dataplus._M_p,
                    local_1f8.m_prefix.field_2._M_allocated_capacity + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  ::~_Rb_tree(&local_2e8);
  if (local_2b8.out1.
      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2b8.out1.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_2b8.out1.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2b8.out1.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_2b8.out0.
      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2b8.out0.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_2b8.out0.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2b8.out0.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_278.in3.
      super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_278.in3.
                    super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_278.in3.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_278.in3.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_278.in2.
      super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_278.in2.
                    super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_278.in2.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_278.in2.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_278.in1.
      super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_278.in1.
                    super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_278.in1.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_278.in1.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_278.in0.
      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_278.in0.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_278.in0.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_278.in0.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return pTVar13;
}

Assistant:

tcu::TestStatus BuiltinPrecisionCaseTestInstance<In, Out>::iterate (void)
{
	typedef typename	In::In0		In0;
	typedef typename	In::In1		In1;
	typedef typename	In::In2		In2;
	typedef typename	In::In3		In3;
	typedef typename	Out::Out0	Out0;
	typedef typename	Out::Out1	Out1;

	Inputs<In>			inputs		= generateInputs(m_samplings, m_caseCtx.floatFormat, m_caseCtx.precision, m_caseCtx.numRandoms, 0xdeadbeefu + m_caseCtx.testContext.getCommandLine().getBaseSeed());
	const FloatFormat&	fmt			= m_caseCtx.floatFormat;
	const int			inCount		= numInputs<In>();
	const int			outCount	= numOutputs<Out>();
	const size_t		numValues	= (inCount > 0) ? inputs.in0.size() : 1;
	Outputs<Out>		outputs		(numValues);
	const FloatFormat	highpFmt	= m_caseCtx.highpFormat;
	const int			maxMsgs		= 100;
	int					numErrors	= 0;
	Environment			env;		// Hoisted out of the inner loop for optimization.
	ResultCollector		status;
	TestLog&			testLog		= m_context.getTestContext().getLog();

	const void*			inputArr[]	=
	{
		&inputs.in0.front(), &inputs.in1.front(), &inputs.in2.front(), &inputs.in3.front(),
	};
	void*				outputArr[]	=
	{
		&outputs.out0.front(), &outputs.out1.front(),
	};

	// Print out the statement and its definitions
	testLog << TestLog::Message << "Statement: " << m_stmt << TestLog::EndMessage;
	{
		ostringstream	oss;
		FuncSet			funcs;

		m_stmt->getUsedFuncs(funcs);
		for (FuncSet::const_iterator it = funcs.begin(); it != funcs.end(); ++it)
		{
			(*it)->printDefinition(oss);
		}
		if (!funcs.empty())
			testLog << TestLog::Message << "Reference definitions:\n" << oss.str()
				  << TestLog::EndMessage;
	}

	switch (inCount)
	{
		case 4: DE_ASSERT(inputs.in3.size() == numValues);
		case 3: DE_ASSERT(inputs.in2.size() == numValues);
		case 2: DE_ASSERT(inputs.in1.size() == numValues);
		case 1: DE_ASSERT(inputs.in0.size() == numValues);
		default: break;
	}

	m_executor->execute(int(numValues), inputArr, outputArr);

	// Initialize environment with dummy values so we don't need to bind in inner loop.
	{
		const typename Traits<In0>::IVal		in0;
		const typename Traits<In1>::IVal		in1;
		const typename Traits<In2>::IVal		in2;
		const typename Traits<In3>::IVal		in3;
		const typename Traits<Out0>::IVal		reference0;
		const typename Traits<Out1>::IVal		reference1;

		env.bind(*m_variables.in0, in0);
		env.bind(*m_variables.in1, in1);
		env.bind(*m_variables.in2, in2);
		env.bind(*m_variables.in3, in3);
		env.bind(*m_variables.out0, reference0);
		env.bind(*m_variables.out1, reference1);
	}

	// For each input tuple, compute output reference interval and compare
	// shader output to the reference.
	for (size_t valueNdx = 0; valueNdx < numValues; valueNdx++)
	{
		bool						result		= true;
		typename Traits<Out0>::IVal	reference0;
		typename Traits<Out1>::IVal	reference1;

		env.lookup(*m_variables.in0) = convert<In0>(fmt, round(fmt, inputs.in0[valueNdx]));
		env.lookup(*m_variables.in1) = convert<In1>(fmt, round(fmt, inputs.in1[valueNdx]));
		env.lookup(*m_variables.in2) = convert<In2>(fmt, round(fmt, inputs.in2[valueNdx]));
		env.lookup(*m_variables.in3) = convert<In3>(fmt, round(fmt, inputs.in3[valueNdx]));

		{
			EvalContext	ctx (fmt, m_caseCtx.precision, env);
			m_stmt->execute(ctx);
		}

		switch (outCount)
		{
			case 2:
				reference1 = convert<Out1>(highpFmt, env.lookup(*m_variables.out1));
				if (!status.check(contains(reference1, outputs.out1[valueNdx]),
									"Shader output 1 is outside acceptable range"))
					result = false;
			case 1:
				reference0 = convert<Out0>(highpFmt, env.lookup(*m_variables.out0));
				if (!status.check(contains(reference0, outputs.out0[valueNdx]),
									"Shader output 0 is outside acceptable range"))
					result = false;
			default: break;
		}

		if (!result)
			++numErrors;

		if ((!result && numErrors <= maxMsgs) || GLS_LOG_ALL_RESULTS)
		{
			MessageBuilder	builder	= testLog.message();

			builder << (result ? "Passed" : "Failed") << " sample:\n";

			if (inCount > 0)
			{
				builder << "\t" << m_variables.in0->getName() << " = "
						<< valueToString(highpFmt, inputs.in0[valueNdx]) << "\n";
			}

			if (inCount > 1)
			{
				builder << "\t" << m_variables.in1->getName() << " = "
						<< valueToString(highpFmt, inputs.in1[valueNdx]) << "\n";
			}

			if (inCount > 2)
			{
				builder << "\t" << m_variables.in2->getName() << " = "
						<< valueToString(highpFmt, inputs.in2[valueNdx]) << "\n";
			}

			if (inCount > 3)
			{
				builder << "\t" << m_variables.in3->getName() << " = "
						<< valueToString(highpFmt, inputs.in3[valueNdx]) << "\n";
			}

			if (outCount > 0)
			{
				builder << "\t" << m_variables.out0->getName() << " = "
						<< valueToString(highpFmt, outputs.out0[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out0>(highpFmt, reference0) << "\n";
			}

			if (outCount > 1)
			{
				builder << "\t" << m_variables.out1->getName() << " = "
						<< valueToString(highpFmt, outputs.out1[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out1>(highpFmt, reference1) << "\n";
			}

			builder << TestLog::EndMessage;
		}
	}

	if (numErrors > maxMsgs)
	{
		testLog << TestLog::Message << "(Skipped " << (numErrors - maxMsgs) << " messages.)"
			  << TestLog::EndMessage;
	}

	if (numErrors == 0)
	{
		testLog << TestLog::Message << "All " << numValues << " inputs passed."
			  << TestLog::EndMessage;
	}
	else
	{
		testLog << TestLog::Message << numErrors << "/" << numValues << " inputs failed."
			  << TestLog::EndMessage;
	}

	if (numErrors)
		return tcu::TestStatus::fail(de::toString(numErrors) + string(" test failed. Check log for the details"));
	else
		return tcu::TestStatus::pass("Pass");

}